

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_avg_cdf_symbols(FRAME_CONTEXT *ctx_left,FRAME_CONTEXT *ctx_tr,int wt_left,int wt_tr)

{
  int iVar1;
  aom_cdf_prob (*cdf_ptr_tr) [11];
  int i;
  long lVar2;
  ulong uVar3;
  aom_cdf_prob (*cdf_ptr_tr_00) [5] [9];
  aom_cdf_prob (*cdf_ptr_left) [11];
  aom_cdf_prob (*cdf_ptr_left_00) [5] [9];
  
  avg_cdf_symbol((aom_cdf_prob *)ctx_left,(aom_cdf_prob *)ctx_tr,0x41,3,2,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->eob_extra_cdf,(aom_cdf_prob *)ctx_tr->eob_extra_cdf,0x5a,
                 3,2,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->dc_sign_cdf,(aom_cdf_prob *)ctx_tr->dc_sign_cdf,6,3,2,
                 wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->eob_flag_cdf16,(aom_cdf_prob *)ctx_tr->eob_flag_cdf16,4,6
                 ,5,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->eob_flag_cdf32,(aom_cdf_prob *)ctx_tr->eob_flag_cdf32,4,7
                 ,6,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->eob_flag_cdf64,(aom_cdf_prob *)ctx_tr->eob_flag_cdf64,4,8
                 ,7,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->eob_flag_cdf128,(aom_cdf_prob *)ctx_tr->eob_flag_cdf128,4
                 ,9,8,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->eob_flag_cdf256,(aom_cdf_prob *)ctx_tr->eob_flag_cdf256,4
                 ,10,9,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->eob_flag_cdf512,(aom_cdf_prob *)ctx_tr->eob_flag_cdf512,4
                 ,0xb,10,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->eob_flag_cdf1024,(aom_cdf_prob *)ctx_tr->eob_flag_cdf1024
                 ,4,0xc,0xb,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->coeff_base_eob_cdf,
                 (aom_cdf_prob *)ctx_tr->coeff_base_eob_cdf,0x28,4,3,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->coeff_base_cdf,(aom_cdf_prob *)ctx_tr->coeff_base_cdf,
                 0x1a4,5,4,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->coeff_br_cdf,(aom_cdf_prob *)ctx_tr->coeff_br_cdf,0xd2,5,
                 4,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->newmv_cdf[0],ctx_tr->newmv_cdf[0],6,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->zeromv_cdf[0],ctx_tr->zeromv_cdf[0],2,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->refmv_cdf[0],ctx_tr->refmv_cdf[0],6,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->drl_cdf[0],ctx_tr->drl_cdf[0],3,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->inter_compound_mode_cdf[0],ctx_tr->inter_compound_mode_cdf[0],8,9,8,
                 wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->compound_type_cdf[0],ctx_tr->compound_type_cdf[0],0x16,3,2,wt_left,wt_tr)
  ;
  avg_cdf_symbol(ctx_left->wedge_idx_cdf[0],ctx_tr->wedge_idx_cdf[0],0x16,0x11,0x10,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->interintra_cdf[0],ctx_tr->interintra_cdf[0],4,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->wedge_interintra_cdf[0],ctx_tr->wedge_interintra_cdf[0],0x16,3,2,wt_left,
                 wt_tr);
  avg_cdf_symbol(ctx_left->interintra_mode_cdf[0],ctx_tr->interintra_mode_cdf[0],4,5,4,wt_left,wt_tr
                );
  avg_cdf_symbol(ctx_left->motion_mode_cdf[0],ctx_tr->motion_mode_cdf[0],0x16,4,3,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->obmc_cdf[0],ctx_tr->obmc_cdf[0],0x16,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->palette_y_size_cdf[0],ctx_tr->palette_y_size_cdf[0],7,8,7,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->palette_uv_size_cdf[0],ctx_tr->palette_uv_size_cdf[0],7,8,7,wt_left,wt_tr
                );
  cdf_ptr_left_00 = ctx_left->palette_uv_color_index_cdf;
  cdf_ptr_tr_00 = ctx_tr->palette_uv_color_index_cdf;
  for (lVar2 = -7; lVar2 != 0; lVar2 = lVar2 + 1) {
    iVar1 = (int)lVar2 + 9;
    avg_cdf_symbol((aom_cdf_prob *)(cdf_ptr_left_00 + -7),(aom_cdf_prob *)(cdf_ptr_tr_00 + -7),5,9,
                   iVar1,wt_left,wt_tr);
    avg_cdf_symbol((aom_cdf_prob *)cdf_ptr_left_00,(aom_cdf_prob *)cdf_ptr_tr_00,5,9,iVar1,wt_left,
                   wt_tr);
    cdf_ptr_tr_00 = cdf_ptr_tr_00 + 1;
    cdf_ptr_left_00 = cdf_ptr_left_00 + 1;
  }
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->palette_y_mode_cdf,
                 (aom_cdf_prob *)ctx_tr->palette_y_mode_cdf,0x15,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->palette_uv_mode_cdf[0],ctx_tr->palette_uv_mode_cdf[0],2,3,2,wt_left,wt_tr
                );
  avg_cdf_symbol(ctx_left->comp_inter_cdf[0],ctx_tr->comp_inter_cdf[0],5,3,2,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->single_ref_cdf,(aom_cdf_prob *)ctx_tr->single_ref_cdf,
                 0x12,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->comp_ref_type_cdf[0],ctx_tr->comp_ref_type_cdf[0],5,3,2,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->uni_comp_ref_cdf,(aom_cdf_prob *)ctx_tr->uni_comp_ref_cdf
                 ,9,3,2,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->comp_ref_cdf,(aom_cdf_prob *)ctx_tr->comp_ref_cdf,9,3,2,
                 wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->comp_bwdref_cdf,(aom_cdf_prob *)ctx_tr->comp_bwdref_cdf,6
                 ,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->txfm_partition_cdf[0],ctx_tr->txfm_partition_cdf[0],0x15,3,2,wt_left,
                 wt_tr);
  avg_cdf_symbol(ctx_left->compound_index_cdf[0],ctx_tr->compound_index_cdf[0],6,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->comp_group_idx_cdf[0],ctx_tr->comp_group_idx_cdf[0],6,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->skip_mode_cdfs[0],ctx_tr->skip_mode_cdfs[0],3,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->skip_txfm_cdfs[0],ctx_tr->skip_txfm_cdfs[0],3,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->intra_inter_cdf[0],ctx_tr->intra_inter_cdf[0],4,3,2,wt_left,wt_tr);
  avg_nmv(&ctx_left->nmvc,&ctx_tr->nmvc,wt_left,wt_tr);
  avg_nmv(&ctx_left->ndvc,&ctx_tr->ndvc,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->intrabc_cdf,ctx_tr->intrabc_cdf,1,3,2,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)&ctx_left->seg,(aom_cdf_prob *)&ctx_tr->seg,3,3,2,wt_left,wt_tr);
  avg_cdf_symbol((ctx_left->seg).spatial_pred_seg_cdf[0],(ctx_tr->seg).spatial_pred_seg_cdf[0],3,9,8
                 ,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->filter_intra_cdfs[0],ctx_tr->filter_intra_cdfs[0],0x16,3,2,wt_left,wt_tr)
  ;
  avg_cdf_symbol(ctx_left->filter_intra_mode_cdf,ctx_tr->filter_intra_mode_cdf,1,6,5,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->switchable_restore_cdf,ctx_tr->switchable_restore_cdf,1,4,3,wt_left,wt_tr
                );
  avg_cdf_symbol(ctx_left->wiener_restore_cdf,ctx_tr->wiener_restore_cdf,1,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->sgrproj_restore_cdf,ctx_tr->sgrproj_restore_cdf,1,3,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->y_mode_cdf[0],ctx_tr->y_mode_cdf[0],4,0xe,0xd,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->uv_mode_cdf,(aom_cdf_prob *)ctx_tr->uv_mode_cdf,0xd,0xf,
                 0xd,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)(ctx_left->uv_mode_cdf + 1),
                 (aom_cdf_prob *)(ctx_tr->uv_mode_cdf + 1),0xd,0xf,0xe,wt_left,wt_tr);
  cdf_ptr_left = ctx_left->partition_cdf;
  cdf_ptr_tr = ctx_tr->partition_cdf;
  for (uVar3 = 0; uVar3 != 0x14; uVar3 = uVar3 + 1) {
    if (uVar3 < 4) {
      iVar1 = 4;
    }
    else if (uVar3 < 0x10) {
      iVar1 = 10;
    }
    else {
      iVar1 = 8;
    }
    avg_cdf_symbol(*cdf_ptr_left,*cdf_ptr_tr,1,0xb,iVar1,wt_left,wt_tr);
    cdf_ptr_tr = cdf_ptr_tr + 1;
    cdf_ptr_left = cdf_ptr_left + 1;
  }
  avg_cdf_symbol(ctx_left->switchable_interp_cdf[0],ctx_tr->switchable_interp_cdf[0],0x10,4,3,
                 wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->kf_y_cdf,(aom_cdf_prob *)ctx_tr->kf_y_cdf,0x19,0xe,0xd,
                 wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->angle_delta_cdf[0],ctx_tr->angle_delta_cdf[0],8,8,7,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)ctx_left->tx_size_cdf,(aom_cdf_prob *)ctx_tr->tx_size_cdf,3,4,2,
                 wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)(ctx_left->tx_size_cdf + 1),
                 (aom_cdf_prob *)(ctx_tr->tx_size_cdf + 1),3,4,3,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)(ctx_left->tx_size_cdf + 2),
                 (aom_cdf_prob *)(ctx_tr->tx_size_cdf + 2),3,4,3,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)(ctx_left->tx_size_cdf + 3),
                 (aom_cdf_prob *)(ctx_tr->tx_size_cdf + 3),3,4,3,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->delta_q_cdf,ctx_tr->delta_q_cdf,1,5,4,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->delta_lf_cdf,ctx_tr->delta_lf_cdf,1,5,4,wt_left,wt_tr);
  for (lVar2 = 0; lVar2 != 0x28; lVar2 = lVar2 + 10) {
    avg_cdf_symbol((aom_cdf_prob *)((long)ctx_left->delta_lf_multi_cdf[0] + lVar2),
                   (aom_cdf_prob *)((long)ctx_tr->delta_lf_multi_cdf[0] + lVar2),1,5,4,wt_left,wt_tr
                  );
  }
  avg_cdf_symbol((aom_cdf_prob *)(ctx_left->intra_ext_tx_cdf + 1),
                 (aom_cdf_prob *)(ctx_tr->intra_ext_tx_cdf + 1),0x34,0x11,7,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)(ctx_left->intra_ext_tx_cdf + 2),
                 (aom_cdf_prob *)(ctx_tr->intra_ext_tx_cdf + 2),0x34,0x11,5,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)(ctx_left->inter_ext_tx_cdf + 1),
                 (aom_cdf_prob *)(ctx_tr->inter_ext_tx_cdf + 1),4,0x11,0x10,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)(ctx_left->inter_ext_tx_cdf + 2),
                 (aom_cdf_prob *)(ctx_tr->inter_ext_tx_cdf + 2),4,0x11,0xc,wt_left,wt_tr);
  avg_cdf_symbol((aom_cdf_prob *)(ctx_left->inter_ext_tx_cdf + 3),
                 (aom_cdf_prob *)(ctx_tr->inter_ext_tx_cdf + 3),4,0x11,2,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->cfl_sign_cdf,ctx_tr->cfl_sign_cdf,1,9,8,wt_left,wt_tr);
  avg_cdf_symbol(ctx_left->cfl_alpha_cdf[0],ctx_tr->cfl_alpha_cdf[0],6,0x11,0x10,wt_left,wt_tr);
  return;
}

Assistant:

void av1_avg_cdf_symbols(FRAME_CONTEXT *ctx_left, FRAME_CONTEXT *ctx_tr,
                         int wt_left, int wt_tr) {
  AVERAGE_CDF(ctx_left->txb_skip_cdf, ctx_tr->txb_skip_cdf, 2);
  AVERAGE_CDF(ctx_left->eob_extra_cdf, ctx_tr->eob_extra_cdf, 2);
  AVERAGE_CDF(ctx_left->dc_sign_cdf, ctx_tr->dc_sign_cdf, 2);
  AVERAGE_CDF(ctx_left->eob_flag_cdf16, ctx_tr->eob_flag_cdf16, 5);
  AVERAGE_CDF(ctx_left->eob_flag_cdf32, ctx_tr->eob_flag_cdf32, 6);
  AVERAGE_CDF(ctx_left->eob_flag_cdf64, ctx_tr->eob_flag_cdf64, 7);
  AVERAGE_CDF(ctx_left->eob_flag_cdf128, ctx_tr->eob_flag_cdf128, 8);
  AVERAGE_CDF(ctx_left->eob_flag_cdf256, ctx_tr->eob_flag_cdf256, 9);
  AVERAGE_CDF(ctx_left->eob_flag_cdf512, ctx_tr->eob_flag_cdf512, 10);
  AVERAGE_CDF(ctx_left->eob_flag_cdf1024, ctx_tr->eob_flag_cdf1024, 11);
  AVERAGE_CDF(ctx_left->coeff_base_eob_cdf, ctx_tr->coeff_base_eob_cdf, 3);
  AVERAGE_CDF(ctx_left->coeff_base_cdf, ctx_tr->coeff_base_cdf, 4);
  AVERAGE_CDF(ctx_left->coeff_br_cdf, ctx_tr->coeff_br_cdf, BR_CDF_SIZE);
  AVERAGE_CDF(ctx_left->newmv_cdf, ctx_tr->newmv_cdf, 2);
  AVERAGE_CDF(ctx_left->zeromv_cdf, ctx_tr->zeromv_cdf, 2);
  AVERAGE_CDF(ctx_left->refmv_cdf, ctx_tr->refmv_cdf, 2);
  AVERAGE_CDF(ctx_left->drl_cdf, ctx_tr->drl_cdf, 2);
  AVERAGE_CDF(ctx_left->inter_compound_mode_cdf,
              ctx_tr->inter_compound_mode_cdf, INTER_COMPOUND_MODES);
  AVERAGE_CDF(ctx_left->compound_type_cdf, ctx_tr->compound_type_cdf,
              MASKED_COMPOUND_TYPES);
  AVERAGE_CDF(ctx_left->wedge_idx_cdf, ctx_tr->wedge_idx_cdf, 16);
  AVERAGE_CDF(ctx_left->interintra_cdf, ctx_tr->interintra_cdf, 2);
  AVERAGE_CDF(ctx_left->wedge_interintra_cdf, ctx_tr->wedge_interintra_cdf, 2);
  AVERAGE_CDF(ctx_left->interintra_mode_cdf, ctx_tr->interintra_mode_cdf,
              INTERINTRA_MODES);
  AVERAGE_CDF(ctx_left->motion_mode_cdf, ctx_tr->motion_mode_cdf, MOTION_MODES);
  AVERAGE_CDF(ctx_left->obmc_cdf, ctx_tr->obmc_cdf, 2);
  AVERAGE_CDF(ctx_left->palette_y_size_cdf, ctx_tr->palette_y_size_cdf,
              PALETTE_SIZES);
  AVERAGE_CDF(ctx_left->palette_uv_size_cdf, ctx_tr->palette_uv_size_cdf,
              PALETTE_SIZES);
  for (int j = 0; j < PALETTE_SIZES; j++) {
    int nsymbs = j + PALETTE_MIN_SIZE;
    AVG_CDF_STRIDE(ctx_left->palette_y_color_index_cdf[j],
                   ctx_tr->palette_y_color_index_cdf[j], nsymbs,
                   CDF_SIZE(PALETTE_COLORS));
    AVG_CDF_STRIDE(ctx_left->palette_uv_color_index_cdf[j],
                   ctx_tr->palette_uv_color_index_cdf[j], nsymbs,
                   CDF_SIZE(PALETTE_COLORS));
  }
  AVERAGE_CDF(ctx_left->palette_y_mode_cdf, ctx_tr->palette_y_mode_cdf, 2);
  AVERAGE_CDF(ctx_left->palette_uv_mode_cdf, ctx_tr->palette_uv_mode_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_inter_cdf, ctx_tr->comp_inter_cdf, 2);
  AVERAGE_CDF(ctx_left->single_ref_cdf, ctx_tr->single_ref_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_ref_type_cdf, ctx_tr->comp_ref_type_cdf, 2);
  AVERAGE_CDF(ctx_left->uni_comp_ref_cdf, ctx_tr->uni_comp_ref_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_ref_cdf, ctx_tr->comp_ref_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_bwdref_cdf, ctx_tr->comp_bwdref_cdf, 2);
  AVERAGE_CDF(ctx_left->txfm_partition_cdf, ctx_tr->txfm_partition_cdf, 2);
  AVERAGE_CDF(ctx_left->compound_index_cdf, ctx_tr->compound_index_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_group_idx_cdf, ctx_tr->comp_group_idx_cdf, 2);
  AVERAGE_CDF(ctx_left->skip_mode_cdfs, ctx_tr->skip_mode_cdfs, 2);
  AVERAGE_CDF(ctx_left->skip_txfm_cdfs, ctx_tr->skip_txfm_cdfs, 2);
  AVERAGE_CDF(ctx_left->intra_inter_cdf, ctx_tr->intra_inter_cdf, 2);
  avg_nmv(&ctx_left->nmvc, &ctx_tr->nmvc, wt_left, wt_tr);
  avg_nmv(&ctx_left->ndvc, &ctx_tr->ndvc, wt_left, wt_tr);
  AVERAGE_CDF(ctx_left->intrabc_cdf, ctx_tr->intrabc_cdf, 2);
  AVERAGE_CDF(ctx_left->seg.pred_cdf, ctx_tr->seg.pred_cdf, 2);
  AVERAGE_CDF(ctx_left->seg.spatial_pred_seg_cdf,
              ctx_tr->seg.spatial_pred_seg_cdf, MAX_SEGMENTS);
  AVERAGE_CDF(ctx_left->filter_intra_cdfs, ctx_tr->filter_intra_cdfs, 2);
  AVERAGE_CDF(ctx_left->filter_intra_mode_cdf, ctx_tr->filter_intra_mode_cdf,
              FILTER_INTRA_MODES);
  AVERAGE_CDF(ctx_left->switchable_restore_cdf, ctx_tr->switchable_restore_cdf,
              RESTORE_SWITCHABLE_TYPES);
  AVERAGE_CDF(ctx_left->wiener_restore_cdf, ctx_tr->wiener_restore_cdf, 2);
  AVERAGE_CDF(ctx_left->sgrproj_restore_cdf, ctx_tr->sgrproj_restore_cdf, 2);
  AVERAGE_CDF(ctx_left->y_mode_cdf, ctx_tr->y_mode_cdf, INTRA_MODES);
  AVG_CDF_STRIDE(ctx_left->uv_mode_cdf[0], ctx_tr->uv_mode_cdf[0],
                 UV_INTRA_MODES - 1, CDF_SIZE(UV_INTRA_MODES));
  AVERAGE_CDF(ctx_left->uv_mode_cdf[1], ctx_tr->uv_mode_cdf[1], UV_INTRA_MODES);
  for (int i = 0; i < PARTITION_CONTEXTS; i++) {
    if (i < 4) {
      AVG_CDF_STRIDE(ctx_left->partition_cdf[i], ctx_tr->partition_cdf[i], 4,
                     CDF_SIZE(10));
    } else if (i < 16) {
      AVERAGE_CDF(ctx_left->partition_cdf[i], ctx_tr->partition_cdf[i], 10);
    } else {
      AVG_CDF_STRIDE(ctx_left->partition_cdf[i], ctx_tr->partition_cdf[i], 8,
                     CDF_SIZE(10));
    }
  }
  AVERAGE_CDF(ctx_left->switchable_interp_cdf, ctx_tr->switchable_interp_cdf,
              SWITCHABLE_FILTERS);
  AVERAGE_CDF(ctx_left->kf_y_cdf, ctx_tr->kf_y_cdf, INTRA_MODES);
  AVERAGE_CDF(ctx_left->angle_delta_cdf, ctx_tr->angle_delta_cdf,
              2 * MAX_ANGLE_DELTA + 1);
  AVG_CDF_STRIDE(ctx_left->tx_size_cdf[0], ctx_tr->tx_size_cdf[0], MAX_TX_DEPTH,
                 CDF_SIZE(MAX_TX_DEPTH + 1));
  AVERAGE_CDF(ctx_left->tx_size_cdf[1], ctx_tr->tx_size_cdf[1],
              MAX_TX_DEPTH + 1);
  AVERAGE_CDF(ctx_left->tx_size_cdf[2], ctx_tr->tx_size_cdf[2],
              MAX_TX_DEPTH + 1);
  AVERAGE_CDF(ctx_left->tx_size_cdf[3], ctx_tr->tx_size_cdf[3],
              MAX_TX_DEPTH + 1);
  AVERAGE_CDF(ctx_left->delta_q_cdf, ctx_tr->delta_q_cdf, DELTA_Q_PROBS + 1);
  AVERAGE_CDF(ctx_left->delta_lf_cdf, ctx_tr->delta_lf_cdf, DELTA_LF_PROBS + 1);
  for (int i = 0; i < FRAME_LF_COUNT; i++) {
    AVERAGE_CDF(ctx_left->delta_lf_multi_cdf[i], ctx_tr->delta_lf_multi_cdf[i],
                DELTA_LF_PROBS + 1);
  }
  AVG_CDF_STRIDE(ctx_left->intra_ext_tx_cdf[1], ctx_tr->intra_ext_tx_cdf[1], 7,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->intra_ext_tx_cdf[2], ctx_tr->intra_ext_tx_cdf[2], 5,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->inter_ext_tx_cdf[1], ctx_tr->inter_ext_tx_cdf[1], 16,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->inter_ext_tx_cdf[2], ctx_tr->inter_ext_tx_cdf[2], 12,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->inter_ext_tx_cdf[3], ctx_tr->inter_ext_tx_cdf[3], 2,
                 CDF_SIZE(TX_TYPES));
  AVERAGE_CDF(ctx_left->cfl_sign_cdf, ctx_tr->cfl_sign_cdf, CFL_JOINT_SIGNS);
  AVERAGE_CDF(ctx_left->cfl_alpha_cdf, ctx_tr->cfl_alpha_cdf,
              CFL_ALPHABET_SIZE);
}